

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::EnumParseTester::~EnumParseTester(EnumParseTester *this)

{
  ~EnumParseTester(this);
  operator_delete(this,0x2a0);
  return;
}

Assistant:

EnumParseTester::~EnumParseTester() {
  // @@protoc_insertion_point(destructor:edition_unittest.EnumParseTester)
  SharedDtor(*this);
}